

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

bool __thiscall tl::StrT<char>::operator==(StrT<char> *this,CStrT<char> o)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  bool bVar4;
  CStrT<char> local_30;
  
  local_30._str = o._str;
  local_30._size = o._size;
  if (this->_size == local_30._size) {
    uVar3 = 0;
    do {
      bVar4 = this->_size <= uVar3;
      if (bVar4) {
        return bVar4;
      }
      cVar2 = CStrT<char>::operator[](&local_30,(u32)uVar3);
      pcVar1 = this->_str + uVar3;
      uVar3 = uVar3 + 1;
    } while (cVar2 == *pcVar1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool StrT<CharT>::operator==(CStrT<CharT> o)const
{
    if(_size != o.size())
        return false;
    for(uint32_t i = 0; i < _size; i++) {
        if(o[i] != _str[i])
            return false;
    }
    return true;
}